

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void equality(Vm *vm)

{
  TokenType TVar1;
  _Bool _Var2;
  
  comparison(vm);
  do {
    _Var2 = match(vm,TOKEN_EQUALS_EQUALS);
    if (!_Var2) {
      _Var2 = match(vm,TOKEN_BANG_EQUALS);
      if (!_Var2) {
        return;
      }
    }
    TVar1 = (vm->compiler).previous.type;
    comparison(vm);
    emit_no_arg(vm,TVar1 == TOKEN_EQUALS_EQUALS ^ OP_NOT_EQUAL);
  } while( true );
}

Assistant:

static void equality(Vm *vm) {
    comparison(vm);

    while (match(vm, TOKEN_EQUALS_EQUALS) || match(vm, TOKEN_BANG_EQUALS)) {
        if (vm->compiler.previous.type == TOKEN_EQUALS_EQUALS) {
            comparison(vm);
            emit_no_arg(vm, OP_EQUAL);
        } else {
            comparison(vm);
            emit_no_arg(vm, OP_NOT_EQUAL);
        }
    }
}